

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::TestSpec::Filter::matches(Filter *this,TestCaseInfo *testCase)

{
  bool bVar1;
  uint uVar2;
  Pattern *pPVar3;
  undefined8 in_RSI;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *in_RDI;
  unique_ptr<Catch::TestSpec::Pattern> *pattern_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1_1;
  unique_ptr<Catch::TestSpec::Pattern> *pattern;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1;
  bool should_use;
  __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
  local_50;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *local_48;
  reference local_40;
  unique_ptr<Catch::TestSpec::Pattern> *local_38;
  __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
  local_30 [2];
  byte local_19;
  undefined8 local_18;
  
  local_18 = in_RSI;
  bVar1 = TestCaseInfo::isHidden((TestCaseInfo *)0x182031);
  local_19 = (bVar1 ^ 0xffU) & 1;
  local_30[0]._M_current =
       (unique_ptr<Catch::TestSpec::Pattern> *)
       std::
       vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
       ::begin(in_RDI);
  local_38 = (unique_ptr<Catch::TestSpec::Pattern> *)
             std::
             vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
             ::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
                        *)in_RDI);
    if (!bVar1) {
      local_48 = in_RDI + 1;
      local_50._M_current =
           (unique_ptr<Catch::TestSpec::Pattern> *)
           std::
           vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ::begin(in_RDI);
      std::
      vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
      ::end(in_RDI);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (in_stack_ffffffffffffffa0,
                           (__normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
                            *)in_RDI);
        if (!bVar1) {
          return (bool)(local_19 & 1);
        }
        in_stack_ffffffffffffffa0 =
             (__normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
              *)__gnu_cxx::
                __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
                ::operator*(&local_50);
        pPVar3 = Detail::unique_ptr<Catch::TestSpec::Pattern>::operator->
                           ((unique_ptr<Catch::TestSpec::Pattern> *)in_stack_ffffffffffffffa0);
        uVar2 = (*pPVar3->_vptr_Pattern[2])(pPVar3,local_18);
        if ((uVar2 & 1) != 0) break;
        __gnu_cxx::
        __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
        ::operator++(&local_50);
      }
      return false;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
               ::operator*(local_30);
    local_19 = 1;
    pPVar3 = Detail::unique_ptr<Catch::TestSpec::Pattern>::operator->(local_40);
    uVar2 = (*pPVar3->_vptr_Pattern[2])(pPVar3,local_18);
    if ((uVar2 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>_>
    ::operator++(local_30);
  }
  return false;
}

Assistant:

bool TestSpec::Filter::matches( TestCaseInfo const& testCase ) const {
        bool should_use = !testCase.isHidden();
        for (auto const& pattern : m_required) {
            should_use = true;
            if (!pattern->matches(testCase)) {
                return false;
            }
        }
        for (auto const& pattern : m_forbidden) {
            if (pattern->matches(testCase)) {
                return false;
            }
        }
        return should_use;
    }